

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtual.c
# Opt level: O0

int store_oprnd(dill_stream c,int tmp_num,int vreg)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int in_EDX;
  int in_ESI;
  dill_stream in_RDI;
  int tmp;
  int typ;
  int offset;
  
  iVar2 = offset_of(in_RDI,in_EDX);
  iVar3 = dill_type_of(in_RDI,in_EDX);
  iVar1 = in_RDI->p->v_tmps[iVar3][in_ESI];
  if (in_EDX < 100) {
    (*in_RDI->j->storei)(in_RDI,iVar3,0,iVar1,in_RDI->dill_param_reg_pointer,(long)iVar2);
  }
  else {
    (*in_RDI->j->storei)(in_RDI,iVar3,0,iVar1,in_RDI->dill_local_pointer,(long)iVar2);
  }
  return iVar1;
}

Assistant:

static int
store_oprnd(dill_stream c, int tmp_num, int vreg)
{
    int offset = offset_of(c, vreg);
    int typ = dill_type_of(c, vreg);
    int tmp = c->p->v_tmps[typ][tmp_num];
    if (vreg >= 100) {
        c->j->storei(c, typ, 0, tmp, c->dill_local_pointer, offset);
    } else {
        c->j->storei(c, typ, 0, tmp, c->dill_param_reg_pointer, offset);
    }
    return tmp;
}